

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O1

bool __thiscall GF2::WW<127UL>::Next(WW<127UL> *this,bool saveWeight)

{
  byte *pbVar1;
  word *pwVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  ulong pos2;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = 0;
  if ((int)CONCAT71(in_register_00000031,saveWeight) == 0) {
    do {
      pwVar2 = this->_words + uVar3;
      *pwVar2 = *pwVar2 + 1;
      if (*pwVar2 != 0) goto LAB_00123152;
      uVar3 = uVar3 + 1;
    } while (uVar3 == 1);
    uVar3 = 2;
LAB_00123152:
    if (uVar3 != 0) {
      if (uVar3 == 2) {
        return false;
      }
      pbVar1 = (byte *)((long)this->_words + 0xf);
      *pbVar1 = *pbVar1 & 0x7f;
      return this->_words[uVar3] != 0;
    }
  }
  else {
    do {
      if ((this->_words[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0) goto LAB_00123107;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x7f);
    uVar3 = 0x7f;
LAB_00123107:
    if (uVar3 == 0x7f) {
      return false;
    }
    uVar5 = 0x7e;
    if (0x7e < uVar3) {
      uVar5 = uVar3;
    }
    pos2 = uVar3;
    do {
      uVar4 = pos2;
      pos2 = uVar5 + 1;
      uVar6 = uVar5;
      if (0x7d < uVar4) break;
      pos2 = uVar4 + 1;
      uVar6 = uVar4;
    } while ((this->_words[pos2 >> 6] >> (pos2 & 0x3f) & 1) != 0);
    if (pos2 == 0x7f) {
      Set(this,0,0x7f - uVar3,true);
      Set(this,0x7f - uVar3,0x7f,false);
      return false;
    }
    Set(this,0,uVar6 - uVar3,true);
    Set(this,uVar6 - uVar3,pos2,false);
    this->_words[pos2 >> 6] = this->_words[pos2 >> 6] | 1L << ((byte)pos2 & 0x3f);
  }
  return true;
}

Assistant:

bool Next(bool saveWeight = false)
	{	
		size_t pos = 0;
		if (!saveWeight)
		{
			// инкремент слова-как-числа
			for (; pos < _wcount && ++_words[pos] == 0; ++pos);
			// перенос не попал в последнее слово представления?
			if (pos + 1 < _wcount) 
				return true;
			// прошли последнее слово?
			if (pos == _wcount) 
				return false;
			// остановились в последнем слове
			Trim(); 
			return _words[pos] != 0;
		}
		// ищем начало серии из единиц
		for (; pos < _n && !Test(pos); ++pos);
		// единиц нет?
		if (pos == _n) 
			return false;
		// ищем окончание серии
		size_t end = pos + 1;
		for (; end < _n && Test(end); ++end);
		// серия справа?
		if (end == _n)
		{
			// возвращаемся к первому слову с данным весом
			First(end - pos);
			return false;
		}
		// разрываем серию
		Set(0, end - pos - 1, 1); 
		Set(end - pos - 1, end, 0);
		Set(end, 1);
		return true;
	}